

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmarkdowntextedit.cpp
# Opt level: O1

bool __thiscall QMarkdownTextEdit::handleReturnEntered(QMarkdownTextEdit *this)

{
  QArrayData *pQVar1;
  int *piVar2;
  QRegularExpression QVar3;
  char cVar4;
  ushort uVar5;
  MoveMode MVar6;
  ulong uVar7;
  undefined8 *puVar8;
  int iVar9;
  QRegularExpressionMatch *this_00;
  ulong uVar10;
  bool bVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QStringView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QString whitespaces;
  QRegularExpression regex;
  QRegularExpressionMatchIterator iterator;
  QString realListCharacter;
  QTextCursor cursor;
  QString t_1;
  QString t;
  QString currentLine;
  QString listCharacter;
  QRegularExpressionMatch match_2;
  QRegularExpressionMatch match;
  QString whitespaceCharacter;
  QRegularExpressionMatch match_1;
  QString currentLineText;
  QString local_138;
  QRegularExpression local_120;
  QArrayData *local_118;
  QString local_110;
  char *local_f8;
  undefined1 local_f0 [12];
  undefined4 uStack_e4;
  char16_t *pcStack_e0;
  qsizetype local_d8;
  QString local_d0;
  QString local_b8;
  QString local_98;
  QRegularExpressionMatch local_80 [8];
  QString local_78;
  QString local_60;
  QRegularExpression local_48 [3];
  QArrayData *local_30 [3];
  
  cVar4 = QPlainTextEdit::isReadOnly();
  if (cVar4 != '\0') {
    return true;
  }
  QPlainTextEdit::textCursor();
  MVar6 = QTextCursor::position();
  QTextCursor::movePosition((MoveOperation)local_f0,4,1);
  QTextCursor::selectedText();
  QVar12.m_data = (storage_type *)0x2a;
  QVar12.m_size = (qsizetype)&local_110;
  QString::fromUtf8(QVar12);
  local_b8.d.d._0_4_ = local_110.d.d._0_4_;
  local_b8.d.d._4_4_ = local_110.d.d._4_4_;
  local_b8.d.ptr._0_4_ = local_110.d.ptr._0_4_;
  local_b8.d.ptr._4_4_ = local_110.d.ptr._4_4_;
  QRegularExpression::QRegularExpression(&local_120,&local_b8,0);
  piVar2 = (int *)CONCAT44(local_b8.d.d._4_4_,local_b8.d.d._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_b8.d.d._4_4_,local_b8.d.d._0_4_),2,8);
    }
  }
  QRegularExpression::globalMatch(&local_118,&local_120,local_30,0,0,0);
  cVar4 = QRegularExpressionMatchIterator::hasNext();
  if (cVar4 == '\0') {
    QVar13.m_data = (storage_type *)0x18;
    QVar13.m_size = (qsizetype)&local_110;
    QString::fromUtf8(QVar13);
    local_b8.d.d._0_4_ = local_110.d.d._0_4_;
    local_b8.d.d._4_4_ = local_110.d.d._4_4_;
    local_b8.d.ptr._0_4_ = local_110.d.ptr._0_4_;
    local_b8.d.ptr._4_4_ = local_110.d.ptr._4_4_;
    local_b8.d.size = CONCAT44(local_110.d.size._4_4_,(undefined4)local_110.d.size);
    QRegularExpression::QRegularExpression((QRegularExpression *)&local_138,&local_b8,0);
    QVar3.d.d = local_120.d.d;
    local_120.d.d =
         (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)
         (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)local_138.d.d;
    local_138.d.d = (Data *)QVar3.d.d;
    QRegularExpression::~QRegularExpression((QRegularExpression *)&local_138);
    piVar2 = (int *)CONCAT44(local_b8.d.d._4_4_,local_b8.d.d._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_b8.d.d._4_4_,local_b8.d.d._0_4_),2,8);
      }
    }
    QRegularExpression::globalMatch(&local_110,&local_120,local_30,0,0,0);
    pQVar1 = (QArrayData *)CONCAT44(local_110.d.d._4_4_,local_110.d.d._0_4_);
    local_110.d.d._0_4_ = SUB84(local_118,0);
    local_110.d.d._4_4_ = (undefined4)((ulong)local_118 >> 0x20);
    local_118 = pQVar1;
    QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
              ((QRegularExpressionMatchIterator *)&local_110);
    cVar4 = QRegularExpressionMatchIterator::hasNext();
    if (cVar4 == '\0') {
      QString::trimmed_helper(&local_b8);
      if (local_b8.d.size < 1) {
        uVar5 = 0;
      }
      else {
        uVar5 = *(ushort *)CONCAT44(local_b8.d.ptr._4_4_,local_b8.d.ptr._0_4_);
      }
      if (local_b8.d.size < 2) {
        bVar11 = false;
      }
      else {
        bVar11 = *(short *)(CONCAT44(local_b8.d.ptr._4_4_,local_b8.d.ptr._0_4_) + 2) == 0x20;
      }
      iVar9 = (int)&local_138;
      if (((uVar5 < 0x2e) && ((0x2c0000000000U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) && (bVar11)) {
        QVar14.m_data = (storage_type *)0x29;
        QVar14.m_size = (qsizetype)&local_110;
        QString::fromUtf8(QVar14);
        local_138.d.d = (Data *)CONCAT44(local_110.d.d._4_4_,local_110.d.d._0_4_);
        local_138.d.ptr._0_4_ = local_110.d.ptr._0_4_;
        local_138.d.ptr._4_4_ = local_110.d.ptr._4_4_;
        QRegularExpression::QRegularExpression((QRegularExpression *)&local_98,&local_138,0);
        QVar3.d.d = local_120.d.d;
        local_120.d.d =
             (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)
             (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)local_98.d.d;
        local_98.d.d = (Data *)QVar3.d.d;
        QRegularExpression::~QRegularExpression((QRegularExpression *)&local_98);
        if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,8);
          }
        }
        QRegularExpression::globalMatch(&local_110,&local_120,local_30,0,0,0);
        pQVar1 = (QArrayData *)CONCAT44(local_110.d.d._4_4_,local_110.d.d._0_4_);
        local_110.d.d._0_4_ = SUB84(local_118,0);
        local_110.d.d._4_4_ = (undefined4)((ulong)local_118 >> 0x20);
        local_118 = pQVar1;
        QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
                  ((QRegularExpressionMatchIterator *)&local_110);
        cVar4 = QRegularExpressionMatchIterator::hasNext();
        if (cVar4 == '\0') goto LAB_00113ace;
        QRegularExpressionMatchIterator::next();
        QRegularExpressionMatch::captured(iVar9);
        QRegularExpressionMatch::captured((int)&local_98);
        QRegularExpressionMatch::captured((int)&local_60);
        QVar15.m_data = (storage_type *)0x17;
        QVar15.m_size = (qsizetype)&local_110;
        QString::fromUtf8(QVar15);
        stack0xffffffffffffff18 = (QArrayData *)CONCAT44(local_110.d.d._4_4_,local_110.d.d._0_4_);
        QRegularExpression::QRegularExpression(local_48,local_f0 + 8,0);
        QRegularExpression::globalMatch(&local_d0,local_48,&local_98,0,0,0);
        pQVar1 = local_118;
        local_118 = &(local_d0.d.d)->super_QArrayData;
        local_d0.d.d = (Data *)pQVar1;
        QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
                  ((QRegularExpressionMatchIterator *)&local_d0);
        QRegularExpression::~QRegularExpression(local_48);
        if (stack0xffffffffffffff18 != (QArrayData *)0x0) {
          LOCK();
          (stack0xffffffffffffff18->ref_)._q_value.super___atomic_base<int>._M_i =
               (stack0xffffffffffffff18->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((stack0xffffffffffffff18->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(stack0xffffffffffffff18,2,8);
          }
        }
        cVar4 = QRegularExpressionMatchIterator::hasNext();
        if (cVar4 != '\0') {
          QRegularExpressionMatchIterator::next();
          QRegularExpressionMatch::captured((int)&local_110);
          local_d0.d.d = (Data *)0x0;
          local_d0.d.ptr = L" [ ]";
          local_d0.d.size = 4;
          operator+((QString *)(local_f0 + 8),&local_110,&local_d0);
          QString::operator=(&local_98,(QString *)(local_f0 + 8));
          if (stack0xffffffffffffff18 != (QArrayData *)0x0) {
            LOCK();
            (stack0xffffffffffffff18->ref_)._q_value.super___atomic_base<int>._M_i =
                 (stack0xffffffffffffff18->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((stack0xffffffffffffff18->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(stack0xffffffffffffff18,2,8);
            }
          }
          if (&(local_d0.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_d0.d.d)->super_QArrayData,2,8);
            }
          }
          piVar2 = (int *)CONCAT44(local_110.d.d._4_4_,local_110.d.d._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              QArrayData::deallocate
                        ((QArrayData *)CONCAT44(local_110.d.d._4_4_,local_110.d.d._0_4_),2,8);
            }
          }
          QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)local_48);
        }
        QTextCursor::setPosition((int)local_f0,MVar6);
        QVar16.m_data = (storage_type *)0x1;
        QVar16.m_size = (qsizetype)&local_d0;
        QString::fromUtf8(QVar16);
        QString::append(&local_d0);
        stack0xffffffffffffff18 = &(local_d0.d.d)->super_QArrayData;
        pcStack_e0 = local_d0.d.ptr;
        local_d8 = local_d0.d.size;
        if (&(local_d0.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QString::append((QString *)(local_f0 + 8));
        local_110.d.d._0_4_ = SUB84(stack0xffffffffffffff18,0);
        local_110.d.d._4_4_ = (undefined4)((ulong)stack0xffffffffffffff18 >> 0x20);
        local_110.d.ptr._0_4_ = SUB84(pcStack_e0,0);
        local_110.d.ptr._4_4_ = (undefined4)((ulong)pcStack_e0 >> 0x20);
        local_110.d.size._0_4_ = (undefined4)local_d8;
        local_110.d.size._4_4_ = (undefined4)((ulong)local_d8 >> 0x20);
        if (stack0xffffffffffffff18 != (QArrayData *)0x0) {
          LOCK();
          (stack0xffffffffffffff18->ref_)._q_value.super___atomic_base<int>._M_i =
               (stack0xffffffffffffff18->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QString::append(&local_110);
        QTextCursor::insertText((QString *)local_f0);
        piVar2 = (int *)CONCAT44(local_110.d.d._4_4_,local_110.d.d._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            QArrayData::deallocate
                      ((QArrayData *)CONCAT44(local_110.d.d._4_4_,local_110.d.d._0_4_),2,8);
          }
        }
        if (stack0xffffffffffffff18 != (QArrayData *)0x0) {
          LOCK();
          (stack0xffffffffffffff18->ref_)._q_value.super___atomic_base<int>._M_i =
               (stack0xffffffffffffff18->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((stack0xffffffffffffff18->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(stack0xffffffffffffff18,2,8);
          }
        }
        if (&(local_d0.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_d0.d.d)->super_QArrayData,2,8);
          }
        }
        QPlainTextEdit::ensureCursorVisible();
        if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,8);
          }
        }
        if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,8);
          }
        }
        if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,8);
          }
        }
        this_00 = (QRegularExpressionMatch *)&local_78;
LAB_00113ff8:
        QRegularExpressionMatch::~QRegularExpressionMatch(this_00);
        bVar11 = true;
      }
      else {
LAB_00113ace:
        QVar17.m_data = (storage_type *)0x19;
        QVar17.m_size = (qsizetype)&local_110;
        QString::fromUtf8(QVar17);
        local_138.d.d = (Data *)CONCAT44(local_110.d.d._4_4_,local_110.d.d._0_4_);
        local_138.d.ptr._0_4_ = local_110.d.ptr._0_4_;
        local_138.d.ptr._4_4_ = local_110.d.ptr._4_4_;
        local_138.d.size = CONCAT44(local_110.d.size._4_4_,(undefined4)local_110.d.size);
        QRegularExpression::QRegularExpression((QRegularExpression *)&local_98,&local_138,0);
        QVar3.d.d = local_120.d.d;
        local_120.d.d =
             (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)
             (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)local_98.d.d;
        local_98.d.d = (Data *)QVar3.d.d;
        QRegularExpression::~QRegularExpression((QRegularExpression *)&local_98);
        if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,8);
          }
        }
        QRegularExpression::globalMatch(&local_110,&local_120,local_30,0,0,0);
        pQVar1 = (QArrayData *)CONCAT44(local_110.d.d._4_4_,local_110.d.d._0_4_);
        local_110.d.d._0_4_ = SUB84(local_118,0);
        local_110.d.d._4_4_ = (undefined4)((ulong)local_118 >> 0x20);
        local_118 = pQVar1;
        QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
                  ((QRegularExpressionMatchIterator *)&local_110);
        cVar4 = QRegularExpressionMatchIterator::hasNext();
        if (cVar4 != '\0') {
          QRegularExpressionMatchIterator::next();
          QRegularExpressionMatch::captured((int)&local_110);
          QRegularExpressionMatch::captured(iVar9);
          QVar18.m_data._4_4_ = local_138.d.ptr._4_4_;
          QVar18.m_data._0_4_ = local_138.d.ptr._0_4_;
          QVar18.m_size = local_138.d.size;
          uVar7 = QString::toIntegral_helper(QVar18,(bool *)0x0,10);
          uVar10 = 0;
          if (uVar7 < 0x100000000) {
            uVar10 = uVar7;
          }
          if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,8);
            }
          }
          QRegularExpressionMatch::captured(iVar9);
          QRegularExpressionMatch::captured((int)&local_98);
          QTextCursor::setPosition((int)local_f0,MVar6);
          QVar19.m_data = (storage_type *)0x1;
          QVar19.m_size = (qsizetype)&local_78;
          QString::fromUtf8(QVar19);
          QString::append(&local_78);
          QString::number((uint)local_48,(int)uVar10 + 1);
          local_d0.d.d = local_78.d.d;
          local_d0.d.ptr = local_78.d.ptr;
          local_d0.d.size = local_78.d.size;
          if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          QString::append(&local_d0);
          stack0xffffffffffffff18 = &(local_d0.d.d)->super_QArrayData;
          pcStack_e0 = local_d0.d.ptr;
          local_d8 = local_d0.d.size;
          if (&(local_d0.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          QString::append((QString *)(local_f0 + 8));
          local_60.d.d = (Data *)stack0xffffffffffffff18;
          local_60.d.ptr = pcStack_e0;
          local_60.d.size = local_d8;
          if (stack0xffffffffffffff18 != (QArrayData *)0x0) {
            LOCK();
            (stack0xffffffffffffff18->ref_)._q_value.super___atomic_base<int>._M_i =
                 (stack0xffffffffffffff18->ref_)._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          QString::append(&local_60);
          QTextCursor::insertText((QString *)local_f0);
          if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,8);
            }
          }
          if (stack0xffffffffffffff18 != (QArrayData *)0x0) {
            LOCK();
            (stack0xffffffffffffff18->ref_)._q_value.super___atomic_base<int>._M_i =
                 (stack0xffffffffffffff18->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((stack0xffffffffffffff18->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(stack0xffffffffffffff18,2,8);
            }
          }
          if (&(local_d0.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_d0.d.d)->super_QArrayData,2,8);
            }
          }
          if (local_48[0].d.d != (QRegularExpressionPrivate *)0x0) {
            LOCK();
            *(int *)local_48[0].d.d = *(int *)local_48[0].d.d + -1;
            UNLOCK();
            if (*(int *)local_48[0].d.d == 0) {
              QArrayData::deallocate((QArrayData *)local_48[0].d.d,2,8);
            }
          }
          if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,8);
            }
          }
          QPlainTextEdit::ensureCursorVisible();
          if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,8);
            }
          }
          if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,8);
            }
          }
          piVar2 = (int *)CONCAT44(local_110.d.d._4_4_,local_110.d.d._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              QArrayData::deallocate
                        ((QArrayData *)CONCAT44(local_110.d.d._4_4_,local_110.d.d._0_4_),2,8);
            }
          }
          this_00 = local_80;
          goto LAB_00113ff8;
        }
        QVar20.m_data = (storage_type *)0x6;
        QVar20.m_size = (qsizetype)&local_110;
        QString::fromUtf8(QVar20);
        local_138.d.d = (Data *)CONCAT44(local_110.d.d._4_4_,local_110.d.d._0_4_);
        local_138.d.ptr._0_4_ = local_110.d.ptr._0_4_;
        local_138.d.ptr._4_4_ = local_110.d.ptr._4_4_;
        QRegularExpression::QRegularExpression((QRegularExpression *)&local_98,&local_138,0);
        QVar3.d.d = local_120.d.d;
        local_120.d.d =
             (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)
             (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)local_98.d.d;
        local_98.d.d = (Data *)QVar3.d.d;
        QRegularExpression::~QRegularExpression((QRegularExpression *)&local_98);
        if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,8);
          }
        }
        QRegularExpression::globalMatch(&local_110,&local_120,local_30,0,0,0);
        pQVar1 = (QArrayData *)CONCAT44(local_110.d.d._4_4_,local_110.d.d._0_4_);
        local_110.d.d._0_4_ = SUB84(local_118,0);
        local_110.d.d._4_4_ = (undefined4)((ulong)local_118 >> 0x20);
        local_118 = pQVar1;
        QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
                  ((QRegularExpressionMatchIterator *)&local_110);
        cVar4 = QRegularExpressionMatchIterator::hasNext();
        if (cVar4 != '\0') {
          QRegularExpressionMatchIterator::next();
          QRegularExpressionMatch::captured((int)&local_110);
          QTextCursor::setPosition((int)local_f0,MVar6);
          QVar21.m_data = (storage_type *)0x1;
          QVar21.m_size = (qsizetype)&local_138;
          QString::fromUtf8(QVar21);
          QString::append(&local_138);
          QTextCursor::insertText((QString *)local_f0);
          if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,8);
            }
          }
          QPlainTextEdit::ensureCursorVisible();
          piVar2 = (int *)CONCAT44(local_110.d.d._4_4_,local_110.d.d._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              QArrayData::deallocate
                        ((QArrayData *)CONCAT44(local_110.d.d._4_4_,local_110.d.d._0_4_),2,8);
            }
          }
          this_00 = (QRegularExpressionMatch *)&local_98;
          goto LAB_00113ff8;
        }
        bVar11 = false;
      }
      piVar2 = (int *)CONCAT44(local_b8.d.d._4_4_,local_b8.d.d._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_b8.d.d._4_4_,local_b8.d.d._0_4_),2,8);
        }
      }
      goto LAB_001135c3;
    }
    local_110.d.d._0_4_ = 2;
    local_110.d.d._4_4_ = 0;
    local_110.d.ptr._0_4_ = 0;
    local_110.d.ptr._4_4_ = 0;
    local_110.d.size._0_4_ = 0;
    local_110.d.size._4_4_ = 0;
    local_f8 = "default";
    QMessageLogger::debug();
    QTextCursor::selectedText();
    puVar8 = (undefined8 *)CONCAT44(local_b8.d.ptr._4_4_,local_b8.d.ptr._0_4_);
    if (puVar8 == (undefined8 *)0x0) {
      puVar8 = &QString::_empty;
    }
    QDebug::putString((QChar *)&local_138,(ulong)puVar8);
    if ((char)local_138.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
        '\x01') {
      QTextStream::operator<<((QTextStream *)local_138.d.d,' ');
    }
    piVar2 = (int *)CONCAT44(local_b8.d.d._4_4_,local_b8.d.d._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_b8.d.d._4_4_,local_b8.d.d._0_4_),2,8);
      }
    }
    QDebug::~QDebug((QDebug *)&local_138);
  }
  bVar11 = true;
  QTextCursor::removeSelectedText();
LAB_001135c3:
  QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
            ((QRegularExpressionMatchIterator *)&local_118);
  QRegularExpression::~QRegularExpression(&local_120);
  if (local_30[0] != (QArrayData *)0x0) {
    LOCK();
    (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_30[0],2,8);
    }
  }
  QTextCursor::~QTextCursor((QTextCursor *)local_f0);
  return bVar11;
}

Assistant:

bool QMarkdownTextEdit::handleReturnEntered() {
    if (isReadOnly()) {
        return true;
    }

    QTextCursor cursor = this->textCursor();
    const int position = cursor.position();

    cursor.movePosition(QTextCursor::StartOfBlock, QTextCursor::KeepAnchor);
    const QString currentLineText = cursor.selectedText();

    // if return is pressed and there is just an unordered list symbol then we
    // want to remove the list symbol Valid listCharacters: '+ ', '-' , '* ', '+
    // [ ] ', '+ [x] ', '- [ ] ', '- [x] ', '* [ ] ', '* [x] '.
    QRegularExpression regex(R"(^(\s*)([+|\-|\*] \[(x| |)\]|[+\-\*])(\s+)$)");
    QRegularExpressionMatchIterator iterator =
        regex.globalMatch(currentLineText);
    if (iterator.hasNext()) {
        cursor.removeSelectedText();
        return true;
    }

    // if return is pressed and there is just an ordered list symbol then we
    // want to remove the list symbol
    regex = QRegularExpression(R"(^(\s*)(\d+[\.|\)])(\s+)$)");
    iterator = regex.globalMatch(currentLineText);
    if (iterator.hasNext()) {
        qDebug() << cursor.selectedText();
        cursor.removeSelectedText();
        return true;
    }

    // Check if we are in an unordered list.
    // We are in a list when we have '* ', '- ' or '+ ', possibly with preceding
    // whitespace. If e.g. user has entered '**text**' and pressed enter - we
    // don't want do anymore list-stuff.
    QString currentLine = currentLineText.trimmed();
    QChar char0;
    QChar char1;
    if (currentLine.length() >= 1)
        char0 = currentLine.at(0);
    if (currentLine.length() >= 2)
        char1 = currentLine.at(1);
    const bool inList =
        ((char0 == QLatin1Char('*') || char0 == QLatin1Char('-') ||
          char0 == QLatin1Char('+')) &&
         char1 == QLatin1Char(' '));

    if (inList) {
        // if the current line starts with a list character (possibly after
        // whitespaces) add the whitespaces at the next line too
        // Valid listCharacters: '+ ', '-' , '* ', '+ [ ] ', '+ [x] ', '- [ ] ',
        // '- [x] ', '* [ ] ', '* [x] '.
        regex =
            QRegularExpression(R"(^(\s*)([+|\-|\*] \[(x| |)\]|[+\-\*])(\s+))");
        iterator = regex.globalMatch(currentLineText);
        if (iterator.hasNext()) {
            const QRegularExpressionMatch match = iterator.next();
            const QString whitespaces = match.captured(1);
            QString listCharacter = match.captured(2);
            const QString whitespaceCharacter = match.captured(4);

            // start new checkbox list item with an unchecked checkbox
            iterator = QRegularExpression(R"(^([+|\-|\*]) \[(x| |)\])")
                           .globalMatch(listCharacter);
            if (iterator.hasNext()) {
                const QRegularExpressionMatch match = iterator.next();
                const QString realListCharacter = match.captured(1);
                listCharacter = realListCharacter + QStringLiteral(" [ ]");
            }

            cursor.setPosition(position);
            cursor.insertText("\n" + whitespaces + listCharacter +
                              whitespaceCharacter);

            // scroll to the cursor if we are at the bottom of the document
            ensureCursorVisible();
            return true;
        }
    }

    // check for ordered lists and increment the list number in the next line
    regex = QRegularExpression(R"(^(\s*)(\d+)([\.|\)])(\s+))");
    iterator = regex.globalMatch(currentLineText);
    if (iterator.hasNext()) {
        const QRegularExpressionMatch match = iterator.next();
        const QString whitespaces = match.captured(1);
        const uint listNumber = match.captured(2).toUInt();
        const QString listMarker = match.captured(3);
        const QString whitespaceCharacter = match.captured(4);

        cursor.setPosition(position);
        cursor.insertText("\n" + whitespaces + QString::number(listNumber + 1) +
                          listMarker + whitespaceCharacter);

        // scroll to the cursor if we are at the bottom of the document
        ensureCursorVisible();
        return true;
    }

    // intent next line with same whitespaces as in current line
    regex = QRegularExpression(R"(^(\s+))");
    iterator = regex.globalMatch(currentLineText);
    if (iterator.hasNext()) {
        const QRegularExpressionMatch match = iterator.next();
        const QString whitespaces = match.captured(1);

        cursor.setPosition(position);
        cursor.insertText("\n" + whitespaces);

        // scroll to the cursor if we are at the bottom of the document
        ensureCursorVisible();
        return true;
    }

    return false;
}